

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intercom_Control_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Intercom_Control_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Intercom_Control_PDU *this)

{
  bool bVar1;
  ostream *poVar2;
  pointer pIVar3;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  string local_2e0 [32];
  __normal_iterator<const_KDIS::DATA_TYPE::IntercomCommunicationParameters_*,_std::vector<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>_>
  local_2c0;
  const_iterator citrEnd;
  const_iterator citr;
  KString local_290;
  KString local_270;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Intercom_Control_PDU *local_18;
  Intercom_Control_PDU *this_local;
  
  local_18 = this;
  this_local = (Intercom_Control_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,&this->super_Header);
  poVar2 = std::operator<<(local_190,(string *)&local_1c0);
  poVar2 = std::operator<<(poVar2,"-Intercom Control PDU-\n");
  poVar2 = std::operator<<(poVar2,"Control Type:                     ");
  DATA_TYPE::ENUMS::GetEnumAsStringControlType_abi_cxx11_
            (&local_1f0,(ENUMS *)(ulong)(byte)(this->super_Header).super_Header6.field_0x27,Value);
  poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
  poVar2 = std::operator<<(poVar2,"\n");
  DATA_TYPE::CommunicationsChannelType::GetAsString_abi_cxx11_(&local_210,&this->m_CommChannelType);
  poVar2 = std::operator<<(poVar2,(string *)&local_210);
  poVar2 = std::operator<<(poVar2,"Source Entity:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_250,&this->m_SrcEnt);
  UTILS::IndentString(&local_230,&local_250,1,'\t');
  poVar2 = std::operator<<(poVar2,(string *)&local_230);
  poVar2 = std::operator<<(poVar2,"Source Communications Device ID:  ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16SrcCommDevID);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Source Line ID:                   ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8SrcLineID);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Transmit Priority:                ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8TransmitPriority);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Transmit Line State:              ");
  DATA_TYPE::ENUMS::GetEnumAsStringTransmitLineState_abi_cxx11_
            (&local_270,(ENUMS *)(ulong)this->m_ui8TransmitLineState,Value_00);
  poVar2 = std::operator<<(poVar2,(string *)&local_270);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Command:                          ");
  DATA_TYPE::ENUMS::GetEnumAsStringLineStateCommand_abi_cxx11_
            (&local_290,(ENUMS *)(ulong)this->m_ui8Command,Value_01);
  poVar2 = std::operator<<(poVar2,(string *)&local_290);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Master Entity ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_((KString *)&citr,&this->m_MstrEntID);
  poVar2 = std::operator<<(poVar2,(string *)&citr);
  poVar2 = std::operator<<(poVar2,"Master Communications Device ID:  ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16MstrCommDeviceID);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Master Channel ID:                ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16MstrChannelID);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Intercom Parameter Length:        ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui32IntrParamLen);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&citr);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  citrEnd = std::
            vector<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
            ::begin(&this->m_vICP);
  local_2c0._M_current =
       (IntercomCommunicationParameters *)
       std::
       vector<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
       ::end(&this->m_vICP);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_2c0);
    if (!bVar1) break;
    pIVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::IntercomCommunicationParameters_*,_std::vector<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>_>
             ::operator->(&citrEnd);
    (*(pIVar3->super_DataTypeBase)._vptr_DataTypeBase[2])(local_2e0);
    std::operator<<(local_190,local_2e0);
    std::__cxx11::string::~string(local_2e0);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::IntercomCommunicationParameters_*,_std::vector<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>_>
    ::operator++(&citrEnd);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Intercom_Control_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Intercom Control PDU-\n"
       << "Control Type:                     " << GetEnumAsStringControlType( m_ui8CtrlTyp ) << "\n"
       << m_CommChannelType.GetAsString()
       << "Source Entity:\n"
       << IndentString( m_SrcEnt.GetAsString(), 1 )
       << "Source Communications Device ID:  " << m_ui16SrcCommDevID                << "\n"
       << "Source Line ID:                   " << ( KUINT16 )m_ui8SrcLineID         << "\n"
       << "Transmit Priority:                " << ( KUINT16 )m_ui8TransmitPriority  << "\n"
       << "Transmit Line State:              " << GetEnumAsStringTransmitLineState( m_ui8TransmitLineState ) << "\n"
       << "Command:                          " << GetEnumAsStringLineStateCommand( m_ui8Command )            << "\n"
       << "Master Entity ID:\n"
       << m_MstrEntID.GetAsString()
       << "Master Communications Device ID:  " << m_ui16MstrCommDeviceID            << "\n"
       << "Master Channel ID:                " << m_ui16MstrChannelID               << "\n"
       << "Intercom Parameter Length:        " << m_ui32IntrParamLen                << "\n";

    vector<IntercomCommunicationParameters>::const_iterator citr = m_vICP.begin();
    vector<IntercomCommunicationParameters>::const_iterator citrEnd = m_vICP.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << citr->GetAsString();
    }

    return ss.str();
}